

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTiming(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,TYPE ttype)

{
  Timer *pTVar1;
  undefined4 in_ESI;
  long in_RDI;
  TYPE ttype_00;
  undefined4 in_stack_fffffffffffffff0;
  
  ttype_00 = (TYPE)((ulong)in_RDI >> 0x20);
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(in_RDI + 0x5b8) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(in_RDI + 0x1480) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(in_RDI + 0x1488) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(in_RDI + 0x1490) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(in_RDI + 0x1498) = pTVar1;
  *(undefined4 *)(in_RDI + 0x5c0) = in_ESI;
  return;
}

Assistant:

void setTiming(Timer::TYPE ttype)
   {
      theTime = TimerFactory::switchTimer(theTime, ttype);
      multTimeSparse = TimerFactory::switchTimer(multTimeSparse, ttype);
      multTimeFull = TimerFactory::switchTimer(multTimeFull, ttype);
      multTimeColwise = TimerFactory::switchTimer(multTimeColwise, ttype);
      multTimeUnsetup = TimerFactory::switchTimer(multTimeUnsetup, ttype);
      timerType = ttype;
   }